

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

bool goodform::can_be<signed_char>(any *v)

{
  float __x;
  double __x_00;
  bool bVar1;
  bool bVar2;
  double dVar3;
  bool bVar4;
  short *psVar5;
  int *piVar6;
  long *plVar7;
  uchar *puVar8;
  unsigned_short *puVar9;
  uint *puVar10;
  unsigned_long *puVar11;
  float *pfVar12;
  double *pdVar13;
  float fVar14;
  
  bVar4 = is<signed_char>(v);
  if (bVar4) {
    get<signed_char>(v);
    bVar4 = true;
  }
  else {
    bVar4 = is<short>(v);
    if (bVar4) {
      psVar5 = get<short>(v);
      bVar4 = (short)(char)*psVar5 == *psVar5;
    }
    else {
      bVar4 = is<int>(v);
      if (bVar4) {
        piVar6 = get<int>(v);
        bVar4 = (int)(char)*piVar6 == *piVar6;
      }
      else {
        bVar4 = is<long>(v);
        if (bVar4) {
          plVar7 = get<long>(v);
          bVar4 = (long)(char)*plVar7 == *plVar7;
        }
        else {
          bVar4 = is<unsigned_char>(v);
          if (bVar4) {
            puVar8 = get<unsigned_char>(v);
            bVar4 = -1 < (char)*puVar8;
          }
          else {
            bVar4 = is<unsigned_short>(v);
            if (bVar4) {
              puVar9 = get<unsigned_short>(v);
              bVar4 = *puVar9 < 0x80;
            }
            else {
              bVar4 = is<unsigned_int>(v);
              if (bVar4) {
                puVar10 = get<unsigned_int>(v);
                bVar4 = *puVar10 < 0x80;
              }
              else {
                bVar4 = is<unsigned_long>(v);
                if (bVar4) {
                  puVar11 = get<unsigned_long>(v);
                  bVar4 = *puVar11 < 0x80;
                }
                else {
                  bVar4 = is<float>(v);
                  if (bVar4) {
                    pfVar12 = get<float>(v);
                    __x = *pfVar12;
                    fVar14 = floorf(__x);
                    bVar2 = __x <= 127.0;
                    bVar1 = fVar14 == __x;
                    bVar4 = __x < -128.0;
                  }
                  else {
                    bVar4 = is<double>(v);
                    if (!bVar4) {
                      bVar4 = is<signed_char>(v);
                      return bVar4;
                    }
                    pdVar13 = get<double>(v);
                    __x_00 = *pdVar13;
                    dVar3 = floor(__x_00);
                    bVar2 = __x_00 <= 127.0;
                    bVar1 = dVar3 == __x_00;
                    bVar4 = __x_00 < -128.0;
                  }
                  bVar4 = (bool)(!bVar4 & -bVar1 & -bVar2);
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool can_be(const any& v)
  {
    if (std::is_integral<T>::value)
    {
      if (is<std::int8_t>(v)) return detail::can_int_fit_value<T>(get<std::int8_t>(v));
      if (is<std::int16_t>(v)) return detail::can_int_fit_value<T>(get<std::int16_t>(v));
      if (is<std::int32_t>(v)) return detail::can_int_fit_value<T>(get<std::int32_t>(v));
      if (is<std::int64_t>(v)) return detail::can_int_fit_value<T>(get<std::int64_t>(v));
      if (is<std::uint8_t>(v)) return detail::can_int_fit_value<T>(get<std::uint8_t>(v));
      if (is<std::uint16_t>(v)) return detail::can_int_fit_value<T>(get<std::uint16_t>(v));
      if (is<std::uint32_t>(v)) return detail::can_int_fit_value<T>(get<std::uint32_t>(v));
      if (is<std::uint64_t>(v)) return detail::can_int_fit_value<T>(get<std::uint64_t>(v));
      if (is<float>(v))
      {
        float tmp = get<float>(v);
        return std::floor(tmp) == tmp && float(std::numeric_limits<T>::max()) >= tmp && float(std::numeric_limits<T>::min()) <= tmp;
      }
      if (is<double>(v))
      {
        double tmp = get<double>(v);
        return std::floor(tmp) == tmp && double(std::numeric_limits<T>::max()) >= tmp && double(std::numeric_limits<T>::min()) <= tmp;
      }
    }
    else if (std::is_same<T, double>::value)
    {
      return true;
    }
    else if (std::is_same<T, float>::value)
    {
      if (!is<double>(v))
        return true;
      else
      {
        float tmp = float(get<double>(v));
        if (double(tmp) == get<double>(v))
          return true;
      }
    }
    return is<T>(v);
  }